

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

void __thiscall
Js::JavascriptExceptionOperators::AutoCatchHandlerExists::FetchNonUserCodeStatus
          (AutoCatchHandlerExists *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  JavascriptFunction *local_28;
  JavascriptFunction *caller;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x12,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->m_previousCatchHandlerToUserCodeStatus == false) {
    local_28 = (JavascriptFunction *)0x0;
    BVar3 = JavascriptStackWalker::GetCaller(&local_28,scriptContext);
    if (((BVar3 != 0) && (local_28 != (JavascriptFunction *)0x0)) &&
       (pFVar5 = JavascriptFunction::GetFunctionBody(local_28), pFVar5 != (FunctionBody *)0x0)) {
      this->m_threadContext->hasCatchHandlerToUserCode =
           ((pFVar5->super_ParseableFunctionInfo).flags & Flags_NonUserCode) == Flags_None;
      return;
    }
  }
  this->m_threadContext->hasCatchHandlerToUserCode = true;
  return;
}

Assistant:

void JavascriptExceptionOperators::AutoCatchHandlerExists::FetchNonUserCodeStatus(ScriptContext * scriptContext)
    {
        Assert(scriptContext);

        bool fFound = false;
        // If the outer try catch was already in the user code, no need to go any further.
        if (!m_previousCatchHandlerToUserCodeStatus)
        {
            Js::JavascriptFunction* caller = nullptr;
            if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
            {
                Js::FunctionBody *funcBody = NULL;
                if (caller != NULL && (funcBody = caller->GetFunctionBody()) != NULL)
                {
                    m_threadContext->SetIsUserCode(funcBody->IsNonUserCode() == false);
                    fFound = true;
                }
            }
        }

        if (!fFound)
        {
            // If not successfully able to find the caller, set this catch handler belongs to the user code.
            m_threadContext->SetIsUserCode(true);
        }
    }